

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_refit.h
# Opt level: O1

BBox3fa * __thiscall
embree::sse2::BVHNRefitT<4,_embree::Instance,_embree::InstancePrimitive>::leafBounds
          (BBox3fa *__return_storage_ptr__,
          BVHNRefitT<4,_embree::Instance,_embree::InstancePrimitive> *this,NodeRef *ref)

{
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar1;
  size_t sVar2;
  Instance *pIVar3;
  long lVar4;
  AffineSpace3ff *pAVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  long lVar27;
  BBox3fa *bounds;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar28;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar29;
  float fVar30;
  float fVar33;
  float fVar34;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar47;
  float fVar48;
  float fVar49;
  undefined1 auVar46 [16];
  undefined1 auVar50 [16];
  float fVar51;
  float fVar55;
  float fVar56;
  undefined1 auVar52 [16];
  float fVar57;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float local_38;
  float local_18;
  float fStack_14;
  
  aVar28 = _DAT_01feb9f0;
  sVar2 = ref->ptr;
  (__return_storage_ptr__->lower).field_0 = _DAT_01feb9f0;
  aVar29 = _DAT_01feba00;
  (__return_storage_ptr__->upper).field_0 = _DAT_01feba00;
  if (sVar2 != 8) {
    lVar27 = (ulong)((uint)sVar2 & 0xf) - 8;
    if (lVar27 != 0) {
      pIVar3 = this->mesh;
      aVar28 = _DAT_01feb9f0;
      aVar29 = _DAT_01feba00;
      do {
        if ((pIVar3->super_Geometry).field_8.field_0x1 == '\x01') {
          pAVar5 = pIVar3->local2world;
          fVar30 = (pAVar5->p).field_0.m128[3];
          fVar33 = (pAVar5->l).vx.field_0.m128[3];
          fVar34 = (pAVar5->l).vy.field_0.m128[3];
          fVar39 = (pAVar5->l).vz.field_0.m128[3];
          aVar1 = (pAVar5->l).vx.field_0.field_1;
          fVar67 = (pAVar5->l).vy.field_0.m128[0];
          fVar69 = (pAVar5->l).vy.field_0.m128[1];
          fVar45 = fVar33 * fVar34 + fVar30 * fVar39;
          fVar38 = fVar33 * fVar34 - fVar30 * fVar39;
          fVar47 = fVar30 * fVar30 + fVar33 * fVar33 + -fVar34 * fVar34 + -fVar39 * fVar39;
          fVar71 = fVar30 * fVar30 - fVar33 * fVar33;
          fVar49 = fVar34 * fVar34 + fVar71 + -fVar39 * fVar39;
          fVar35 = fVar33 * fVar39 - fVar30 * fVar34;
          fVar43 = fVar30 * fVar34 + fVar33 * fVar39;
          fVar40 = fVar34 * fVar39 + fVar30 * fVar33;
          fVar66 = fVar34 * fVar39 - fVar30 * fVar33;
          fVar37 = fVar39 * fVar39 + fVar71 + -fVar34 * fVar34;
          fVar30 = (pAVar5->l).vz.field_0.m128[0];
          fVar33 = (pAVar5->l).vz.field_0.m128[1];
          fVar34 = (pAVar5->l).vz.field_0.m128[2];
          fVar45 = fVar45 + fVar45;
          fVar35 = fVar35 + fVar35;
          fVar39 = (pAVar5->p).field_0.m128[0];
          fVar71 = (pAVar5->p).field_0.m128[1];
          fVar36 = (pAVar5->p).field_0.m128[2];
          fVar38 = fVar38 + fVar38;
          fVar40 = fVar40 + fVar40;
          fVar43 = fVar43 + fVar43;
          fVar66 = fVar66 + fVar66;
          fVar68 = fVar47 * 1.0 + fVar45 * 0.0 + fVar35 * 0.0;
          fVar70 = fVar47 * 0.0 + fVar45 * 1.0 + fVar35 * 0.0;
          fVar41 = fVar47 * 0.0 + fVar45 * 0.0 + fVar35 * 1.0;
          fVar42 = fVar47 * 0.0 + fVar45 * 0.0 + fVar35 * 0.0;
          fVar45 = fVar38 * 1.0 + fVar49 * 0.0 + fVar40 * 0.0;
          fVar47 = fVar38 * 0.0 + fVar49 * 1.0 + fVar40 * 0.0;
          fVar48 = fVar38 * 0.0 + fVar49 * 0.0 + fVar40 * 1.0;
          fVar49 = fVar38 * 0.0 + fVar49 * 0.0 + fVar40 * 0.0;
          fVar55 = fVar43 * 1.0 + fVar66 * 0.0 + fVar37 * 0.0;
          fVar56 = fVar43 * 0.0 + fVar66 * 1.0 + fVar37 * 0.0;
          fVar57 = fVar43 * 0.0 + fVar66 * 0.0 + fVar37 * 1.0;
          fVar66 = fVar43 * 0.0 + fVar66 * 0.0 + fVar37 * 0.0;
          local_38 = aVar1.x;
          fVar35 = local_38 * fVar68 + fVar45 * 0.0 + fVar55 * 0.0;
          fVar37 = local_38 * fVar70 + fVar47 * 0.0 + fVar56 * 0.0;
          fVar38 = local_38 * fVar41 + fVar48 * 0.0 + fVar57 * 0.0;
          fVar40 = local_38 * fVar42 + fVar49 * 0.0 + fVar66 * 0.0;
          lVar4 = *(long *)&(pIVar3->super_Geometry).field_0x58;
          local_18 = aVar1.y;
          fStack_14 = aVar1.z;
          fVar44 = fVar67 * fVar68 + fVar69 * fVar45 + fVar55 * 0.0;
          fVar51 = fVar67 * fVar70 + fVar69 * fVar47 + fVar56 * 0.0;
          fVar61 = fVar67 * fVar41 + fVar69 * fVar48 + fVar57 * 0.0;
          fVar64 = fVar67 * fVar42 + fVar69 * fVar49 + fVar66 * 0.0;
          fVar65 = fVar30 * fVar68 + fVar33 * fVar45 + fVar34 * fVar55;
          fVar73 = fVar30 * fVar70 + fVar33 * fVar47 + fVar34 * fVar56;
          fVar72 = fVar30 * fVar41 + fVar33 * fVar48 + fVar34 * fVar57;
          fVar74 = fVar30 * fVar42 + fVar33 * fVar49 + fVar34 * fVar66;
          fVar33 = fVar39 * fVar68 + fVar71 * fVar45 + fVar36 * fVar55 + local_18 + 0.0;
          fVar67 = fVar39 * fVar70 + fVar71 * fVar47 + fVar36 * fVar56 + fStack_14 + 0.0;
          fVar69 = fVar39 * fVar41 + fVar71 * fVar48 + fVar36 * fVar57 +
                   (pAVar5->l).vy.field_0.m128[2] + 0.0;
          fVar36 = fVar39 * fVar42 + fVar71 * fVar49 + fVar36 * fVar66 + 0.0;
          auVar31 = minps(*(undefined1 (*) [16])(lVar4 + 0x10),*(undefined1 (*) [16])(lVar4 + 0x30))
          ;
          auVar50 = maxps(*(undefined1 (*) [16])(lVar4 + 0x20),*(undefined1 (*) [16])(lVar4 + 0x40))
          ;
          fVar49 = auVar31._0_4_;
          fVar56 = auVar31._4_4_;
          fVar30 = auVar31._8_4_;
          fVar55 = fVar30 * fVar65 + fVar33;
          fVar57 = fVar30 * fVar73 + fVar67;
          fVar58 = fVar30 * fVar72 + fVar69;
          fVar59 = fVar30 * fVar74 + fVar36;
          fVar60 = fVar56 * fVar44;
          fVar62 = fVar56 * fVar51;
          fVar63 = fVar56 * fVar61;
          fVar56 = fVar56 * fVar64;
          fVar66 = fVar60 + fVar55;
          fVar68 = fVar62 + fVar57;
          fVar70 = fVar63 + fVar58;
          fVar41 = fVar56 + fVar59;
          fVar45 = fVar49 * fVar35;
          fVar47 = fVar49 * fVar37;
          fVar48 = fVar49 * fVar38;
          fVar49 = fVar49 * fVar40;
          fVar30 = fVar45 + fVar66;
          fVar34 = fVar47 + fVar68;
          fVar39 = fVar48 + fVar70;
          fVar71 = fVar49 + fVar41;
          auVar31._4_4_ = fVar34;
          auVar31._0_4_ = fVar30;
          auVar31._8_4_ = fVar39;
          auVar31._12_4_ = fVar71;
          auVar31 = minps((undefined1  [16])_DAT_01feb9f0,auVar31);
          auVar52._4_4_ = fVar34;
          auVar52._0_4_ = fVar30;
          auVar52._8_4_ = fVar39;
          auVar52._12_4_ = fVar71;
          auVar52 = maxps((undefined1  [16])_DAT_01feba00,auVar52);
          fVar42 = auVar50._0_4_;
          fVar43 = auVar50._4_4_;
          fVar30 = auVar50._8_4_;
          fVar33 = fVar30 * fVar65 + fVar33;
          fVar67 = fVar30 * fVar73 + fVar67;
          fVar69 = fVar30 * fVar72 + fVar69;
          fVar36 = fVar30 * fVar74 + fVar36;
          fVar60 = fVar60 + fVar33;
          fVar62 = fVar62 + fVar67;
          fVar63 = fVar63 + fVar69;
          fVar56 = fVar56 + fVar36;
          fVar30 = fVar45 + fVar60;
          fVar34 = fVar47 + fVar62;
          fVar39 = fVar48 + fVar63;
          fVar71 = fVar49 + fVar56;
          auVar15._4_4_ = fVar34;
          auVar15._0_4_ = fVar30;
          auVar15._8_4_ = fVar39;
          auVar15._12_4_ = fVar71;
          auVar31 = minps(auVar31,auVar15);
          auVar16._4_4_ = fVar34;
          auVar16._0_4_ = fVar30;
          auVar16._8_4_ = fVar39;
          auVar16._12_4_ = fVar71;
          auVar52 = maxps(auVar52,auVar16);
          fVar44 = fVar43 * fVar44;
          fVar51 = fVar43 * fVar51;
          fVar61 = fVar43 * fVar61;
          fVar43 = fVar43 * fVar64;
          fVar55 = fVar55 + fVar44;
          fVar57 = fVar57 + fVar51;
          fVar58 = fVar58 + fVar61;
          fVar59 = fVar59 + fVar43;
          fVar30 = fVar45 + fVar55;
          fVar34 = fVar47 + fVar57;
          fVar39 = fVar48 + fVar58;
          fVar71 = fVar49 + fVar59;
          auVar17._4_4_ = fVar34;
          auVar17._0_4_ = fVar30;
          auVar17._8_4_ = fVar39;
          auVar17._12_4_ = fVar71;
          auVar31 = minps(auVar31,auVar17);
          auVar18._4_4_ = fVar34;
          auVar18._0_4_ = fVar30;
          auVar18._8_4_ = fVar39;
          auVar18._12_4_ = fVar71;
          auVar52 = maxps(auVar52,auVar18);
          fVar44 = fVar44 + fVar33;
          fVar51 = fVar51 + fVar67;
          fVar61 = fVar61 + fVar69;
          fVar43 = fVar43 + fVar36;
          fVar45 = fVar45 + fVar44;
          fVar47 = fVar47 + fVar51;
          fVar48 = fVar48 + fVar61;
          fVar49 = fVar49 + fVar43;
          auVar50._4_4_ = fVar47;
          auVar50._0_4_ = fVar45;
          auVar50._8_4_ = fVar48;
          auVar50._12_4_ = fVar49;
          auVar31 = minps(auVar31,auVar50);
          auVar12._4_4_ = fVar47;
          auVar12._0_4_ = fVar45;
          auVar12._8_4_ = fVar48;
          auVar12._12_4_ = fVar49;
          auVar52 = maxps(auVar52,auVar12);
          fVar35 = fVar42 * fVar35;
          fVar37 = fVar42 * fVar37;
          fVar38 = fVar42 * fVar38;
          fVar42 = fVar42 * fVar40;
          fVar66 = fVar66 + fVar35;
          fVar68 = fVar68 + fVar37;
          fVar70 = fVar70 + fVar38;
          fVar41 = fVar41 + fVar42;
          auVar13._4_4_ = fVar68;
          auVar13._0_4_ = fVar66;
          auVar13._8_4_ = fVar70;
          auVar13._12_4_ = fVar41;
          auVar31 = minps(auVar31,auVar13);
          auVar14._4_4_ = fVar68;
          auVar14._0_4_ = fVar66;
          auVar14._8_4_ = fVar70;
          auVar14._12_4_ = fVar41;
          auVar52 = maxps(auVar52,auVar14);
          fVar60 = fVar60 + fVar35;
          fVar62 = fVar62 + fVar37;
          fVar63 = fVar63 + fVar38;
          fVar56 = fVar56 + fVar42;
          auVar21._4_4_ = fVar62;
          auVar21._0_4_ = fVar60;
          auVar21._8_4_ = fVar63;
          auVar21._12_4_ = fVar56;
          auVar31 = minps(auVar31,auVar21);
          auVar22._4_4_ = fVar62;
          auVar22._0_4_ = fVar60;
          auVar22._8_4_ = fVar63;
          auVar22._12_4_ = fVar56;
          auVar52 = maxps(auVar52,auVar22);
          auVar54._0_4_ = fVar55 + fVar35;
          auVar54._4_4_ = fVar57 + fVar37;
          auVar54._8_4_ = fVar58 + fVar38;
          auVar54._12_4_ = fVar59 + fVar42;
          auVar31 = minps(auVar31,auVar54);
          auVar52 = maxps(auVar52,auVar54);
          auVar46._0_4_ = fVar35 + fVar44;
          auVar46._4_4_ = fVar37 + fVar51;
          auVar46._8_4_ = fVar38 + fVar61;
          auVar46._12_4_ = fVar42 + fVar43;
          auVar31 = minps(auVar31,auVar46);
          auVar52 = maxps(auVar52,auVar46);
        }
        else {
          lVar4 = *(long *)&(pIVar3->super_Geometry).field_0x58;
          pAVar5 = pIVar3->local2world;
          fVar30 = (pAVar5->l).vx.field_0.m128[0];
          fVar33 = (pAVar5->l).vx.field_0.m128[1];
          fVar34 = (pAVar5->l).vx.field_0.m128[2];
          fVar39 = (pAVar5->l).vx.field_0.m128[3];
          fVar67 = (pAVar5->l).vy.field_0.m128[0];
          fVar69 = (pAVar5->l).vy.field_0.m128[1];
          fVar71 = (pAVar5->l).vy.field_0.m128[2];
          fVar36 = (pAVar5->l).vy.field_0.m128[3];
          fVar35 = (pAVar5->l).vz.field_0.m128[0];
          fVar37 = (pAVar5->l).vz.field_0.m128[1];
          fVar38 = (pAVar5->l).vz.field_0.m128[2];
          fVar40 = (pAVar5->l).vz.field_0.m128[3];
          fVar45 = (pAVar5->p).field_0.m128[0];
          fVar47 = (pAVar5->p).field_0.m128[1];
          fVar48 = (pAVar5->p).field_0.m128[2];
          fVar49 = (pAVar5->p).field_0.m128[3];
          auVar52 = minps(*(undefined1 (*) [16])(lVar4 + 0x10),*(undefined1 (*) [16])(lVar4 + 0x30))
          ;
          auVar31 = maxps(*(undefined1 (*) [16])(lVar4 + 0x20),*(undefined1 (*) [16])(lVar4 + 0x40))
          ;
          fVar44 = auVar52._0_4_;
          fVar61 = auVar52._4_4_;
          fVar66 = auVar52._8_4_;
          fVar51 = fVar66 * fVar35 + fVar45;
          fVar55 = fVar66 * fVar37 + fVar47;
          fVar56 = fVar66 * fVar38 + fVar48;
          fVar57 = fVar66 * fVar40 + fVar49;
          fVar58 = fVar61 * fVar67;
          fVar59 = fVar61 * fVar69;
          fVar60 = fVar61 * fVar71;
          fVar61 = fVar61 * fVar36;
          fVar62 = fVar58 + fVar51;
          fVar63 = fVar59 + fVar55;
          fVar64 = fVar60 + fVar56;
          fVar65 = fVar61 + fVar57;
          fVar41 = fVar44 * fVar30;
          fVar42 = fVar44 * fVar33;
          fVar43 = fVar44 * fVar34;
          fVar44 = fVar44 * fVar39;
          fVar66 = fVar41 + fVar62;
          fVar68 = fVar42 + fVar63;
          fVar70 = fVar43 + fVar64;
          fVar73 = fVar44 + fVar65;
          auVar25._4_4_ = fVar68;
          auVar25._0_4_ = fVar66;
          auVar25._8_4_ = fVar70;
          auVar25._12_4_ = fVar73;
          auVar52 = minps((undefined1  [16])_DAT_01feb9f0,auVar25);
          auVar26._4_4_ = fVar68;
          auVar26._0_4_ = fVar66;
          auVar26._8_4_ = fVar70;
          auVar26._12_4_ = fVar73;
          auVar50 = maxps((undefined1  [16])_DAT_01feba00,auVar26);
          fVar66 = auVar31._0_4_;
          fVar68 = auVar31._4_4_;
          fVar70 = auVar31._8_4_;
          fVar45 = fVar70 * fVar35 + fVar45;
          fVar47 = fVar70 * fVar37 + fVar47;
          fVar48 = fVar70 * fVar38 + fVar48;
          fVar49 = fVar70 * fVar40 + fVar49;
          fVar58 = fVar58 + fVar45;
          fVar59 = fVar59 + fVar47;
          fVar60 = fVar60 + fVar48;
          fVar61 = fVar61 + fVar49;
          fVar35 = fVar41 + fVar58;
          fVar37 = fVar42 + fVar59;
          fVar38 = fVar43 + fVar60;
          fVar40 = fVar44 + fVar61;
          auVar6._4_4_ = fVar37;
          auVar6._0_4_ = fVar35;
          auVar6._8_4_ = fVar38;
          auVar6._12_4_ = fVar40;
          auVar31 = minps(auVar52,auVar6);
          auVar7._4_4_ = fVar37;
          auVar7._0_4_ = fVar35;
          auVar7._8_4_ = fVar38;
          auVar7._12_4_ = fVar40;
          auVar52 = maxps(auVar50,auVar7);
          fVar67 = fVar68 * fVar67;
          fVar69 = fVar68 * fVar69;
          fVar71 = fVar68 * fVar71;
          fVar68 = fVar68 * fVar36;
          fVar51 = fVar51 + fVar67;
          fVar55 = fVar55 + fVar69;
          fVar56 = fVar56 + fVar71;
          fVar57 = fVar57 + fVar68;
          fVar36 = fVar41 + fVar51;
          fVar35 = fVar42 + fVar55;
          fVar37 = fVar43 + fVar56;
          fVar38 = fVar44 + fVar57;
          auVar8._4_4_ = fVar35;
          auVar8._0_4_ = fVar36;
          auVar8._8_4_ = fVar37;
          auVar8._12_4_ = fVar38;
          auVar31 = minps(auVar31,auVar8);
          auVar9._4_4_ = fVar35;
          auVar9._0_4_ = fVar36;
          auVar9._8_4_ = fVar37;
          auVar9._12_4_ = fVar38;
          auVar52 = maxps(auVar52,auVar9);
          fVar67 = fVar67 + fVar45;
          fVar69 = fVar69 + fVar47;
          fVar71 = fVar71 + fVar48;
          fVar68 = fVar68 + fVar49;
          fVar41 = fVar41 + fVar67;
          fVar42 = fVar42 + fVar69;
          fVar43 = fVar43 + fVar71;
          fVar44 = fVar44 + fVar68;
          auVar10._4_4_ = fVar42;
          auVar10._0_4_ = fVar41;
          auVar10._8_4_ = fVar43;
          auVar10._12_4_ = fVar44;
          auVar31 = minps(auVar31,auVar10);
          auVar11._4_4_ = fVar42;
          auVar11._0_4_ = fVar41;
          auVar11._8_4_ = fVar43;
          auVar11._12_4_ = fVar44;
          auVar52 = maxps(auVar52,auVar11);
          fVar30 = fVar66 * fVar30;
          fVar33 = fVar66 * fVar33;
          fVar34 = fVar66 * fVar34;
          fVar66 = fVar66 * fVar39;
          fVar62 = fVar62 + fVar30;
          fVar63 = fVar63 + fVar33;
          fVar64 = fVar64 + fVar34;
          fVar65 = fVar65 + fVar66;
          auVar23._4_4_ = fVar63;
          auVar23._0_4_ = fVar62;
          auVar23._8_4_ = fVar64;
          auVar23._12_4_ = fVar65;
          auVar31 = minps(auVar31,auVar23);
          auVar24._4_4_ = fVar63;
          auVar24._0_4_ = fVar62;
          auVar24._8_4_ = fVar64;
          auVar24._12_4_ = fVar65;
          auVar52 = maxps(auVar52,auVar24);
          fVar58 = fVar58 + fVar30;
          fVar59 = fVar59 + fVar33;
          fVar60 = fVar60 + fVar34;
          fVar61 = fVar61 + fVar66;
          auVar19._4_4_ = fVar59;
          auVar19._0_4_ = fVar58;
          auVar19._8_4_ = fVar60;
          auVar19._12_4_ = fVar61;
          auVar31 = minps(auVar31,auVar19);
          auVar20._4_4_ = fVar59;
          auVar20._0_4_ = fVar58;
          auVar20._8_4_ = fVar60;
          auVar20._12_4_ = fVar61;
          auVar52 = maxps(auVar52,auVar20);
          auVar53._0_4_ = fVar51 + fVar30;
          auVar53._4_4_ = fVar55 + fVar33;
          auVar53._8_4_ = fVar56 + fVar34;
          auVar53._12_4_ = fVar57 + fVar66;
          auVar31 = minps(auVar31,auVar53);
          auVar52 = maxps(auVar52,auVar53);
          auVar32._0_4_ = fVar30 + fVar67;
          auVar32._4_4_ = fVar33 + fVar69;
          auVar32._8_4_ = fVar34 + fVar71;
          auVar32._12_4_ = fVar66 + fVar68;
          auVar31 = minps(auVar31,auVar32);
          auVar52 = maxps(auVar52,auVar32);
        }
        aVar29.m128 = (__m128)maxps(aVar29.m128,auVar52);
        aVar28.m128 = (__m128)minps(aVar28.m128,auVar31);
        lVar27 = lVar27 + -1;
      } while (lVar27 != 0);
    }
    (__return_storage_ptr__->lower).field_0 = aVar28;
    (__return_storage_ptr__->upper).field_0 = aVar29;
  }
  return __return_storage_ptr__;
}

Assistant:

virtual const BBox3fa leafBounds (NodeRef& ref) const
      {
        size_t num; char* prim = ref.leaf(num);
        if (unlikely(ref == BVH::emptyNode)) return empty;

        BBox3fa bounds = empty;
        for (size_t i=0; i<num; i++)
            bounds.extend(((Primitive*)prim)[i].update(mesh));
        return bounds;
      }